

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistryTest.cpp
# Opt level: O2

void __thiscall
TEST_TestRegistry_ResetPluginsWorks_Test::testBody(TEST_TestRegistry_ResetPluginsWorks_Test *this)

{
  TestRegistry *pTVar1;
  int iVar2;
  UtestShell *pUVar3;
  TestTerminator *pTVar4;
  SimpleString local_78;
  MyTestPluginDummy plugin2;
  MyTestPluginDummy plugin1;
  
  SimpleString::SimpleString((SimpleString *)&plugin2,"Plugin-1");
  MyTestPluginDummy::MyTestPluginDummy(&plugin1,(SimpleString *)&plugin2);
  SimpleString::~SimpleString((SimpleString *)&plugin2);
  SimpleString::SimpleString(&local_78,"Plugin-2");
  MyTestPluginDummy::MyTestPluginDummy(&plugin2,&local_78);
  SimpleString::~SimpleString(&local_78);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[0xd])(pTVar1,&plugin1);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry;
  (*pTVar1->_vptr_TestRegistry[0xd])(pTVar1,&plugin2);
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x12])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,2,(long)iVar2,"LONGS_EQUAL(2, myRegistry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x146,pTVar4);
  (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry[0xe])();
  pUVar3 = UtestShell::getCurrent();
  iVar2 = (*((this->super_TEST_GROUP_CppUTestGroupTestRegistry).myRegistry)->_vptr_TestRegistry
            [0x12])();
  pTVar4 = UtestShell::getCurrentTestTerminator();
  (*pUVar3->_vptr_UtestShell[0xe])
            (pUVar3,0,(long)iVar2,"LONGS_EQUAL(0, myRegistry->countPlugins()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestRegistryTest.cpp"
             ,0x148,pTVar4);
  TestPlugin::~TestPlugin(&plugin2.super_TestPlugin);
  TestPlugin::~TestPlugin(&plugin1.super_TestPlugin);
  return;
}

Assistant:

TEST(TestRegistry, ResetPluginsWorks)
{
    MyTestPluginDummy plugin1("Plugin-1");
    MyTestPluginDummy plugin2("Plugin-2");
    myRegistry->installPlugin(&plugin1);
    myRegistry->installPlugin(&plugin2);
    LONGS_EQUAL(2, myRegistry->countPlugins());
    myRegistry->resetPlugins();
    LONGS_EQUAL(0, myRegistry->countPlugins());
}